

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O1

Gia_Man_t * Gia_ManUnrollDup(Gia_Man_t *p,Vec_Int_t *vLimit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pNew;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  if (vLimit->nSize != 0) {
    __assert_fail("Vec_IntSize(vLimit) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                  ,0x70,"Gia_Man_t *Gia_ManUnrollDup(Gia_Man_t *, Vec_Int_t *)");
  }
  pNew = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar4);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar4);
  }
  pNew->pName = pcVar7;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar4);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar4);
  }
  pNew->pSpec = pcVar7;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  Vec_IntPush(vLimit,pNew->nObjs);
  pVVar8 = p->vCos;
  uVar9 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    lVar12 = 0;
    do {
      if ((int)uVar9 <= lVar12) goto LAB_00737d1e;
      iVar1 = pVVar8->pArray[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00737ce0;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManUnrollDup_rec(pNew,p->pObjs + iVar1,iVar1);
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCos;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar12 < (long)(uVar9 - (long)p->nRegs));
  }
  Vec_IntPush(vLimit,pNew->nObjs);
  uVar9 = (ulong)(uint)pNew->nObjs;
  if (1 < pNew->nObjs) {
    uVar13 = 1;
    lVar12 = 0x14;
    do {
      if ((long)vLimit->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      if (uVar13 == (uint)vLimit->pArray[(long)vLimit->nSize + -1]) {
        Vec_IntPush(vLimit,(int)uVar9);
      }
      if ((long)pNew->nObjs <= (long)uVar13) goto LAB_00737ce0;
      iVar1 = *(int *)(&pNew->pObjs->field_0x0 + lVar12);
      if (((long)iVar1 < 0) || (iVar2 = p->nObjs, iVar2 <= iVar1)) goto LAB_00737ce0;
      pGVar5 = p->pObjs;
      if ((((uint)*(undefined8 *)(pGVar5 + iVar1) & 0x9fffffff) == 0x9fffffff) &&
         (uVar10 = (uint)((ulong)*(undefined8 *)(pGVar5 + iVar1) >> 0x20),
         p->vCis->nSize - p->nRegs <= (int)(uVar10 & 0x1fffffff))) {
        uVar10 = uVar10 & 0x1fffffff;
        iVar1 = p->vCis->nSize;
        if ((int)uVar10 < iVar1 - p->nRegs) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar3 = p->vCos->nSize;
        uVar10 = (iVar3 - iVar1) + uVar10;
        if (((int)uVar10 < 0) || (iVar3 <= (int)uVar10)) {
LAB_00737d1e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vCos->pArray[uVar10];
        lVar11 = (long)iVar1;
        if ((lVar11 < 0) || (iVar2 <= iVar1)) {
LAB_00737ce0:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar5[lVar11].Value != 0xffffffff) {
          __assert_fail("!~pObj->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFrames.c"
                        ,0x88,"Gia_Man_t *Gia_ManUnrollDup(Gia_Man_t *, Vec_Int_t *)");
        }
        if (iVar2 <= iVar1) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Gia_ManUnrollDup_rec(pNew,pGVar5 + lVar11,iVar1);
      }
      uVar13 = uVar13 + 1;
      uVar9 = (ulong)pNew->nObjs;
      lVar12 = lVar12 + 0xc;
    } while ((long)uVar13 < (long)uVar9);
  }
  Gia_ManSetRegNum(pNew,0);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManUnrollDup( Gia_Man_t * p, Vec_Int_t * vLimit )  
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vLimit) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );

    // save constant class
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );
 
    // create first class
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManUnrollDup_rec( pNew, pObj, Gia_ObjId(p, pObj) );
    Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );

    // create next classes
    for ( i = 1; i < Gia_ManObjNum(pNew); i++ )
    {
        if ( i == Vec_IntEntryLast(vLimit) )
            Vec_IntPush( vLimit, Gia_ManObjNum(pNew) );
        pObj = Gia_ManObj( p, Gia_ManObj(pNew, i)->Value );
        if ( Gia_ObjIsRo(p, pObj) )
        {
            pObj = Gia_ObjRoToRi(p, pObj);
            assert( !~pObj->Value );
            Gia_ManUnrollDup_rec( pNew, pObj, Gia_ObjId(p, pObj) );
        }
    }
    Gia_ManSetRegNum( pNew, 0 );
    return pNew;
}